

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmsgs.cc
# Opt level: O0

string * encodeCompactNodeId_abi_cxx11_(string *__return_storage_ptr__,bdId *id)

{
  string local_50;
  int local_20;
  undefined1 local_19;
  int i;
  bdId *id_local;
  string *enc;
  
  local_19 = 0;
  _i = id;
  id_local = (bdId *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_20 = 0; local_20 < 0x14; local_20 = local_20 + 1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(_i->id).data[local_20]);
  }
  encodeCompactPeerId_abi_cxx11_(&local_50,&_i->addr);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string encodeCompactNodeId(bdId *id) {
	std::string enc;
	for (int i = 0; i < BITDHT_KEY_LEN; i++) {
		enc += id->id.data[i];
	}
	/* convert ip address (already in network order) */
	enc += encodeCompactPeerId(&(id->addr));
	return enc;
}